

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::TreeEnsembleRegressor::ByteSizeLong(TreeEnsembleRegressor *this)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  
  if (this->treeensemble_ == (TreeEnsembleParameters *)0x0 ||
      this == (TreeEnsembleRegressor *)_TreeEnsembleRegressor_default_instance_) {
    sVar3 = 0;
  }
  else {
    sVar3 = TreeEnsembleParameters::ByteSizeLong(this->treeensemble_);
    uVar4 = (uint)sVar3 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if ((long)this->postevaluationtransform_ != 0) {
    uVar5 = (long)this->postevaluationtransform_ | 1;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar5 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
  return sVar3;
}

Assistant:

size_t TreeEnsembleRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleRegressor)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
  if (this->_internal_has_treeensemble()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *treeensemble_);
  }

  // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
  if (this->_internal_postevaluationtransform() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_postevaluationtransform());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}